

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QStringView>::emplace<QStringView>
          (QPodArrayOps<QStringView> *this,qsizetype i,QStringView *args)

{
  long lVar1;
  storage_type_conflict *psVar2;
  bool bVar3;
  qsizetype qVar4;
  QStringView *pQVar5;
  qsizetype *in_RDX;
  long in_RSI;
  QArrayDataPointer<QStringView> *in_RDI;
  long in_FS_OFFSET;
  QStringView *where;
  GrowthPosition pos;
  bool detach;
  QStringView tmp;
  QArrayDataPointer<QStringView> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar7;
  QArrayDataPointer<QStringView> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar3 = QArrayDataPointer<QStringView>::needsDetach(in_stack_ffffffffffffffc0);
  uVar7 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffcc);
  if (!bVar3) {
    if ((in_RSI == in_RDI->size) &&
       (qVar4 = QArrayDataPointer<QStringView>::freeSpaceAtEnd
                          ((QArrayDataPointer<QStringView> *)
                           CONCAT44(uVar7,in_stack_ffffffffffffffc8)), qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QStringView>::end(in_stack_ffffffffffffffc0);
      pQVar5->m_size = *in_RDX;
      pQVar5->m_data = (storage_type_conflict *)in_RDX[1];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0053bd4d;
    }
    if ((in_RSI == 0) &&
       (qVar4 = QArrayDataPointer<QStringView>::freeSpaceAtBegin
                          ((QArrayDataPointer<QStringView> *)
                           CONCAT44(uVar7,in_stack_ffffffffffffffc8)), qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QStringView>::begin((QArrayDataPointer<QStringView> *)0x53bc76);
      pQVar5[-1].m_size = *in_RDX;
      pQVar5[-1].m_data = (storage_type_conflict *)in_RDX[1];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0053bd4d;
    }
  }
  qVar4 = *in_RDX;
  psVar2 = (storage_type_conflict *)in_RDX[1];
  uVar6 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar6 = 1;
  }
  QArrayDataPointer<QStringView>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QStringView **)CONCAT44(uVar7,uVar6),in_stack_ffffffffffffffc0);
  pQVar5 = createHole((QPodArrayOps<QStringView> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
                      (qsizetype)in_RDX,CONCAT44(uVar7,uVar6));
  pQVar5->m_size = qVar4;
  pQVar5->m_data = psVar2;
LAB_0053bd4d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }